

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

bool __thiscall
vkb::detail::GenericFeatureChain::find_and_match
          (GenericFeatureChain *this,GenericFeatureChain *extensions_requested)

{
  pointer pGVar1;
  bool bVar2;
  GenericFeaturesPNextNode *supported;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  *__range3;
  GenericFeaturesPNextNode *requested_extension_node;
  pointer requested;
  bool bVar3;
  
  requested = (extensions_requested->nodes).
              super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (extensions_requested->nodes).
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar3 = requested == pGVar1;
    if (bVar3) {
      return true;
    }
    supported = (this->nodes).
                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (supported ==
          (this->nodes).
          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        return false;
      }
      if (supported->sType == requested->sType) break;
      supported = supported + 1;
    }
    bVar2 = GenericFeaturesPNextNode::match(requested,supported);
    requested = requested + 1;
  } while (bVar2);
  return bVar3;
}

Assistant:

bool GenericFeatureChain::find_and_match(GenericFeatureChain const& extensions_requested) const noexcept {
    for (const auto& requested_extension_node : extensions_requested.nodes) {
        bool found = false;
        for (const auto& supported_node : nodes) {
            if (supported_node.sType == requested_extension_node.sType) {
                found = true;
                if (!GenericFeaturesPNextNode::match(requested_extension_node, supported_node)) return false;
                break;
            }
        }
        if (!found) return false;
    }
    return true;
}